

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KktCheck.cpp
# Opt level: O2

void __thiscall KktCheck::chComplementarySlackness(KktCheck *this)

{
  double *pdVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  int iVar5;
  ostream *poVar6;
  bool bVar7;
  long lVar8;
  
  bVar7 = true;
  for (iVar5 = 0; this->i = iVar5, iVar5 < this->numCol; iVar5 = iVar5 + 1) {
    lVar8 = (long)iVar5;
    dVar2 = (this->colLower).super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start[lVar8];
    if (-1e+200 < dVar2) {
      dVar3 = (this->colValue).super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start[lVar8];
      dVar4 = (this->colDual).super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start[lVar8];
      if (this->tol < ABS((dVar3 - dVar2) * dVar4)) {
        pdVar1 = (this->colUpper).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start + lVar8;
        if (((dVar3 != *pdVar1) || (NAN(dVar3) || NAN(*pdVar1))) && (this->tol < ABS(dVar4))) {
          if (this->print == 1) {
            poVar6 = std::operator<<((ostream *)&std::cout,"Comp. slackness fail: ");
            poVar6 = std::operator<<(poVar6,"l[");
            poVar6 = (ostream *)
                     std::ostream::operator<<
                               (poVar6,(this->cIndexRev).
                                       super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                       super__Vector_impl_data._M_start[this->i]);
            std::operator<<(poVar6,"]=");
            poVar6 = std::ostream::_M_insert<double>
                               ((this->colLower).super__Vector_base<double,_std::allocator<double>_>
                                ._M_impl.super__Vector_impl_data._M_start[this->i]);
            poVar6 = std::operator<<(poVar6,", x[");
            poVar6 = (ostream *)std::ostream::operator<<(poVar6,this->i);
            std::operator<<(poVar6,"]=");
            poVar6 = std::ostream::_M_insert<double>
                               ((this->colValue).super__Vector_base<double,_std::allocator<double>_>
                                ._M_impl.super__Vector_impl_data._M_start[this->i]);
            poVar6 = std::operator<<(poVar6,", z[");
            poVar6 = (ostream *)std::ostream::operator<<(poVar6,this->i);
            std::operator<<(poVar6,"]=");
            poVar6 = std::ostream::_M_insert<double>
                               ((this->colDual).super__Vector_base<double,_std::allocator<double>_>.
                                _M_impl.super__Vector_impl_data._M_start[this->i]);
            std::endl<char,std::char_traits<char>>(poVar6);
            iVar5 = this->i;
            lVar8 = (long)iVar5;
          }
          bVar7 = false;
        }
      }
    }
    dVar2 = (this->colUpper).super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start[lVar8];
    if (dVar2 < 1e+200) {
      dVar3 = (this->colValue).super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start[lVar8];
      dVar4 = (this->colDual).super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start[lVar8];
      if (this->tol < ABS((dVar2 - dVar3) * dVar4)) {
        pdVar1 = (this->colLower).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start + lVar8;
        if (((dVar3 != *pdVar1) || (NAN(dVar3) || NAN(*pdVar1))) && (this->tol < ABS(dVar4))) {
          if (this->print == 1) {
            poVar6 = std::operator<<((ostream *)&std::cout,"Comp. slackness fail: x[");
            poVar6 = (ostream *)
                     std::ostream::operator<<
                               (poVar6,(this->cIndexRev).
                                       super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                       super__Vector_impl_data._M_start[this->i]);
            std::operator<<(poVar6,"]=");
            poVar6 = std::ostream::_M_insert<double>
                               ((this->colValue).super__Vector_base<double,_std::allocator<double>_>
                                ._M_impl.super__Vector_impl_data._M_start[this->i]);
            poVar6 = std::operator<<(poVar6,", u[");
            poVar6 = (ostream *)std::ostream::operator<<(poVar6,this->i);
            std::operator<<(poVar6,"]=");
            poVar6 = std::ostream::_M_insert<double>
                               ((this->colUpper).super__Vector_base<double,_std::allocator<double>_>
                                ._M_impl.super__Vector_impl_data._M_start[this->i]);
            poVar6 = std::operator<<(poVar6,", z[");
            poVar6 = (ostream *)std::ostream::operator<<(poVar6,this->i);
            std::operator<<(poVar6,"]=");
            poVar6 = std::ostream::_M_insert<double>
                               ((this->colDual).super__Vector_base<double,_std::allocator<double>_>.
                                _M_impl.super__Vector_impl_data._M_start[this->i]);
            std::endl<char,std::char_traits<char>>(poVar6);
            iVar5 = this->i;
          }
          bVar7 = false;
        }
      }
    }
  }
  if (bVar7) {
    if (this->print == 1) {
      std::operator<<((ostream *)&std::cout,"Complementary Slackness.\n");
      return;
    }
  }
  else {
    if (this->print == 1) {
      std::operator<<((ostream *)&std::cout,"KKT check error: Comp slackness fail.\n");
    }
    this->istrueGlb = true;
  }
  return;
}

Assistant:

void KktCheck::chComplementarySlackness() {
	bool istrue = true;
	
	for (i=0; i<numCol;i++) {
		if (colLower[i] > -HSOL_CONST_INF)  
			if (abs( (colValue[i]- colLower[i])*(colDual[i]) ) > tol && colValue[i]!=colUpper[i] && abs(colDual[i])> tol) {
				if (print == 1) 
					cout<<"Comp. slackness fail: "<<"l["<<cIndexRev[i]<<"]="<<colLower[i]<<", x["<<i<<"]="<<colValue[i]<<", z["<<i<<"]="<<colDual[i]<<endl;
					//cout<<"Comp. slackness fail: "<<"l["<<i<<"]="<<colLower[i]<<", x["<<i<<"]="<<colValue[i]<<", z["<<i<<"]="<<colDual[i]<<endl;
				istrue = false;
			}
		if (colUpper[i] < HSOL_CONST_INF) 
			if (abs( (colUpper[i] - colValue[i])*(colDual[i]) )> tol && colValue[i]!=colLower[i] && abs(colDual[i])> tol) {
				if (print == 1) 
					cout<<"Comp. slackness fail: x["<<cIndexRev[i]<<"]="<<colValue[i]<<", u["<<i<<"]="<<colUpper[i]<<", z["<<i<<"]="<<colDual[i]<<endl;
					//cout<<"Comp. slackness fail: x["<<i<<"]="<<colValue[i]<<", u["<<i<<"]="<<colUpper[i]<<", z["<<i<<"]="<<colDual[i]<<endl;
				istrue = false;
			}
	}
	
	if (istrue) {
		if (print == 1) 
			cout<<"Complementary Slackness.\n";}
	else {
		if (print == 1) 
			cout<<"KKT check error: Comp slackness fail.\n";
		istrueGlb = true;
	}
}